

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O0

ON_SubDComponentRef * __thiscall
ON_SubDComponentRefList::Append
          (ON_SubDComponentRefList *this,ON_SubDRef *subd_ref,ON_SubDComponentPtr component_ptr,
          ON_SubDComponentLocation component_location,ON__UINT_PTR reference_id)

{
  bool bVar1;
  ON_SubD *this_00;
  undefined1 local_78 [8];
  ON_SubDComponentRef r;
  ON__UINT_PTR reference_id_local;
  ON_SubDComponentLocation component_location_local;
  ON_SubDRef *subd_ref_local;
  ON_SubDComponentRefList *this_local;
  ON_SubDComponentPtr component_ptr_local;
  
  r.m_reference_id = reference_id;
  this_local = (ON_SubDComponentRefList *)component_ptr.m_ptr;
  this_00 = ON_SubDRef::SubD(subd_ref);
  bVar1 = ON_SubD::IsEmpty(this_00);
  if ((bVar1) || (bVar1 = ON_SubDComponentPtr::IsNull((ON_SubDComponentPtr *)&this_local), !bVar1))
  {
    component_ptr_local.m_ptr = (ON__UINT_PTR)&ON_SubDComponentRef::Empty;
  }
  else {
    ON_SubDComponentRef::Create
              ((ON_SubDComponentRef *)local_78,subd_ref,(ON_SubDComponentPtr)this_local,
               component_location,r.m_reference_id);
    component_ptr_local.m_ptr = (ON__UINT_PTR)Append(this,(ON_SubDComponentRef *)local_78);
    ON_SubDComponentRef::~ON_SubDComponentRef((ON_SubDComponentRef *)local_78);
  }
  return (ON_SubDComponentRef *)component_ptr_local.m_ptr;
}

Assistant:

const ON_SubDComponentRef& ON_SubDComponentRefList::Append(
  const ON_SubDRef & subd_ref, 
  ON_SubDComponentPtr component_ptr, 
  ON_SubDComponentLocation component_location,
  ON__UINT_PTR reference_id
)
{
  for (;;)
  {
    if (subd_ref.SubD().IsEmpty())
      break;
    if (false == component_ptr.IsNull())
      break;
    const ON_SubDComponentRef r(ON_SubDComponentRef::Create(subd_ref, component_ptr, component_location,reference_id));
    return Append(&r);
  }
  return ON_SubDComponentRef::Empty;
}